

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  nk_chart_type nVar1;
  int iVar2;
  int iVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_vec2 nVar6;
  nk_bool nVar7;
  uint uVar8;
  nk_command_buffer *b;
  nk_flags nVar9;
  uint uVar10;
  nk_color nVar11;
  int *piVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  
  nVar9 = 0;
  if (((ctx != (nk_context *)0x0) && (pnVar4 = ctx->current, slot < 4 && pnVar4 != (nk_window *)0x0)
      ) && (pnVar5 = pnVar4->layout, nVar9 = 0, slot < (pnVar5->chart).slot)) {
    nVar1 = (pnVar5->chart).slots[slot].type;
    if (nVar1 == NK_CHART_COLUMN) {
      iVar2 = (pnVar5->chart).slots[slot].count;
      iVar3 = (pnVar5->chart).slots[slot].index;
      if (iVar2 <= iVar3) {
        return 0;
      }
      if (iVar2 == 0) {
        fVar13 = 0.0;
      }
      else {
        fVar13 = ((pnVar5->chart).w - (float)(iVar2 + -1)) / (float)iVar2;
      }
      fVar17 = (pnVar5->chart).h;
      fVar15 = (pnVar5->chart).slots[slot].range;
      fVar14 = value / fVar15;
      fVar16 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar16 = fVar14;
      }
      fVar16 = fVar16 * fVar17;
      if (0.0 <= value) {
        fVar14 = (pnVar5->chart).slots[slot].min;
        fVar18 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar18 = fVar14;
        }
        fVar14 = -fVar15;
        if (-fVar15 <= fVar15) {
          fVar14 = fVar15;
        }
        fVar17 = ((pnVar5->chart).y + fVar17) - ((fVar18 + value) / fVar14) * fVar17;
      }
      else {
        fVar15 = (value - (pnVar5->chart).slots[slot].max) / fVar15;
        fVar14 = -fVar15;
        if (-fVar15 <= fVar15) {
          fVar14 = fVar15;
        }
        fVar17 = (fVar17 * fVar14 + (pnVar5->chart).y) - fVar16;
      }
      fVar15 = (float)iVar3;
      nVar11 = (pnVar5->chart).slots[slot].color;
      rect_02.h = fVar16;
      rect_02.w = fVar13;
      fVar15 = fVar15 * fVar13 + (pnVar5->chart).x + fVar15;
      nVar9 = 0;
      if ((((pnVar5->flags & 0x1000) == 0) && (fVar14 = (ctx->input).mouse.pos.x, fVar15 <= fVar14))
         && ((fVar14 < fVar13 + fVar15 &&
             ((fVar13 = (ctx->input).mouse.pos.y, nVar9 = 0, fVar17 <= fVar13 &&
              (fVar13 < fVar16 + fVar17)))))) {
        if ((ctx->input).mouse.buttons[0].down == 0) {
          nVar9 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
        }
        else {
          nVar9 = 1;
        }
        nVar11 = (pnVar5->chart).slots[slot].highlight;
      }
      rect_02.y = fVar17;
      rect_02.x = fVar15;
      nk_fill_rect(&pnVar4->buffer,rect_02,0.0,nVar11);
    }
    else {
      if (nVar1 != NK_CHART_LINES) {
        return 0;
      }
      b = &pnVar4->buffer;
      fVar13 = (pnVar5->chart).slots[slot].min;
      fVar13 = (value - fVar13) / ((pnVar5->chart).slots[slot].max - fVar13);
      iVar2 = (pnVar5->chart).slots[slot].index;
      if (iVar2 == 0) {
        fVar17 = (pnVar5->chart).x;
        (pnVar5->chart).slots[slot].last.x = fVar17;
        fVar15 = (pnVar5->chart).h;
        fVar13 = ((pnVar5->chart).y + fVar15) - fVar13 * fVar15;
        (pnVar5->chart).slots[slot].last.y = fVar13;
        rect_00.x = fVar17 + -2.0;
        rect_00.y = fVar13 + -2.0;
        nVar11 = (pnVar5->chart).slots[slot].color;
        nVar9 = 0;
        if ((pnVar5->flags & 0x1000) == 0) {
          fVar15 = (ctx->input).mouse.pos.x;
          if ((fVar17 + -3.0 <= fVar15) && (fVar15 < fVar17 + -3.0 + 6.0)) {
            fVar17 = (ctx->input).mouse.pos.y;
            nVar9 = 0;
            if ((fVar13 + -3.0 <= fVar17) && (fVar17 < fVar13 + -3.0 + 6.0)) {
              rect_00.w = 4.0;
              rect_00.h = 4.0;
              uVar8 = nk_input_is_mouse_hovering_rect(&ctx->input,rect_00);
              if ((ctx->input).mouse.buttons[0].down == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2;
              }
              nVar9 = uVar10 | uVar8;
              nVar11 = (pnVar5->chart).slots[slot].highlight;
            }
          }
        }
        rect_03.y = rect_00.y;
        rect_03.x = rect_00.x;
        rect_03.w = 4.0;
        rect_03.h = 4.0;
        nk_fill_rect(b,rect_03,0.0,nVar11);
      }
      else {
        nVar11 = (pnVar5->chart).slots[slot].color;
        fVar17 = (pnVar5->chart).h;
        fVar15 = (pnVar5->chart).x +
                 (float)iVar2 * ((pnVar5->chart).w / (float)(pnVar5->chart).slots[slot].count);
        fVar13 = (pnVar5->chart).y + fVar17 + fVar17 * -fVar13;
        nk_stroke_line(b,(pnVar5->chart).slots[slot].last.x,(pnVar5->chart).slots[slot].last.y,
                       fVar15,fVar13,1.0,nVar11);
        nVar9 = 0;
        if (((pnVar5->flags & 0x1000) == 0) &&
           (rect.x = fVar15 + -3.0, rect.y = fVar13 + -3.0, rect.w = 6.0, rect.h = 6.0,
           nVar7 = nk_input_is_mouse_hovering_rect(&ctx->input,rect), nVar7 != 0)) {
          if ((ctx->input).mouse.buttons[0].down == 0) {
            nVar9 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
          }
          else {
            nVar9 = 1;
          }
          nVar11 = (pnVar5->chart).slots[slot].highlight;
        }
        rect_01.x = fVar15 + -2.0;
        rect_01.y = fVar13 + -2.0;
        rect_01.w = 4.0;
        rect_01.h = 4.0;
        nk_fill_rect(b,rect_01,0.0,nVar11);
        nVar6.y = fVar13;
        nVar6.x = fVar15;
        (pnVar5->chart).slots[slot].last = nVar6;
      }
    }
    piVar12 = &(pnVar5->chart).slots[slot].index;
    *piVar12 = *piVar12 + 1;
  }
  return nVar9;
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
nk_flags flags;
struct nk_window *win;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
NK_ASSERT(slot < ctx->current->layout->chart.slot);
if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
if (slot >= ctx->current->layout->chart.slot) return nk_false;

win = ctx->current;
if (win->layout->chart.slot < slot) return nk_false;
switch (win->layout->chart.slots[slot].type) {
case NK_CHART_LINES:
flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
case NK_CHART_COLUMN:
flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
default:
case NK_CHART_MAX:
flags = 0;
}
return flags;
}